

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O2

bool goodform::msgpack::deserialize(istream *input,any *v)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  mapped_type *pmVar6;
  long *plVar7;
  size_t i;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  allocator_type local_71;
  uint32_t sz_be;
  undefined4 uStack_6c;
  any key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Storage *local_48;
  undefined8 local_40;
  ulong local_38;
  
  uVar2 = std::istream::get();
  bVar11 = *(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0;
  if (!bVar11) goto LAB_0013584f;
  uVar3 = uVar2 & 0xff;
  if (uVar3 < 0x80) {
    key._M_manager =
         (_func_void__Op_any_ptr__Arg_ptr *)
         (CONCAT71(key._M_manager._1_7_,(byte)uVar2) & 0xffffffffffffff7f);
    std::any::operator=(v,(uchar *)&key);
    goto LAB_00135890;
  }
  if (0xdf < uVar3) {
    key._M_manager =
         (_func_void__Op_any_ptr__Arg_ptr *)CONCAT71(key._M_manager._1_7_,-((byte)uVar2 & 0x1f));
    std::any::operator=(v,(char *)&key);
    goto LAB_00135890;
  }
  if (uVar3 < 0x90) {
    local_58._8_8_ = &key._M_storage;
    key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    key._M_storage._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = 0;
    local_40 = 0;
    local_48 = (_Storage *)local_58._8_8_;
    std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                           *)&key);
    uVar8 = (ulong)(uVar2 & 0xf);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)&key);
    bVar11 = true;
    while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      key._M_storage._M_ptr = (void *)0x0;
      bVar11 = deserialize(input,&key);
      if ((bVar11) && (bVar11 = is<std::__cxx11::string>(&key), bVar11)) {
        pmVar4 = std::
                 any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>&>
                           (v);
        pbVar5 = std::any_cast<std::__cxx11::string&>(&key);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 ::operator[](pmVar4,pbVar5);
        bVar11 = deserialize(input,pmVar6);
      }
      else {
        bVar11 = false;
      }
      std::any::reset(&key);
    }
    return bVar11;
  }
  if (uVar3 < 0xa0) {
    std::vector<std::any,_std::allocator<std::any>_>::vector
              ((vector<std::any,_std::allocator<std::any>_> *)&key,(ulong)(uVar2 & 0xf),
               (allocator_type *)&sz_be);
    for (uVar8 = 0; (uVar2 & 0xf) << 4 != uVar8; uVar8 = uVar8 + 0x10) {
      deserialize(input,(any *)(key._M_manager + uVar8));
    }
    std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)&key);
    goto LAB_001359ec;
  }
  if (uVar3 < 0xc0) {
    key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_58;
    key._M_storage._M_ptr = (void *)0x0;
    local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::resize((ulong)&key);
    std::istream::read((char *)input,(long)key._M_manager);
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      bVar11 = true;
      std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &key);
      goto LAB_00135a45;
    }
LAB_001359db:
    bVar11 = false;
LAB_00135a45:
    std::__cxx11::string::~string((string *)&key);
    return bVar11;
  }
  bVar11 = false;
  switch(uVar2 & 0xff) {
  case 0xc0:
    key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    std::any::operator=(v,&key._M_manager);
    goto LAB_00135890;
  case 0xc2:
    key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)((ulong)key._M_manager._1_7_ << 8);
    goto LAB_00135f78;
  case 0xc3:
    key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)CONCAT71(key._M_manager._1_7_,1);
LAB_00135f78:
    std::any::operator=(v,(bool *)&key);
LAB_00135890:
    bVar11 = true;
    break;
  case 0xc4:
    bVar1 = std::istream::get();
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&key,(ulong)bVar1,(allocator_type *)&sz_be);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(vector<char,_std::allocator<char>_> *)&key);
        goto LAB_00135f61;
      }
LAB_00135f5f:
      bVar11 = false;
LAB_00135f61:
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&key);
      return bVar11;
    }
    goto LAB_0013584f;
  case 0xc5:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&key,
                 (ulong)(ushort)((ushort)sz_be << 8 | (ushort)sz_be >> 8),&local_71);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(vector<char,_std::allocator<char>_> *)&key);
        goto LAB_00135f61;
      }
      goto LAB_00135f5f;
    }
    goto LAB_0013584f;
  case 0xc6:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&key,
                 (ulong)(sz_be >> 0x18 | (sz_be & 0xff0000) >> 8 | (sz_be & 0xff00) << 8 |
                        sz_be << 0x18),&local_71);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(vector<char,_std::allocator<char>_> *)&key);
        goto LAB_00135f61;
      }
      goto LAB_00135f5f;
    }
    goto LAB_0013584f;
  case 0xca:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)CONCAT44(uStack_6c,
                                (uint)key._M_manager >> 0x18 |
                                ((uint)key._M_manager & 0xff0000) >> 8 |
                                ((uint)key._M_manager & 0xff00) << 8 | (uint)key._M_manager << 0x18)
      ;
      std::any::operator=(v,(float *)&sz_be);
    }
    break;
  case 0xcb:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)((ulong)key._M_manager >> 0x38 |
                        ((ulong)key._M_manager & 0xff000000000000) >> 0x28 |
                        ((ulong)key._M_manager & 0xff0000000000) >> 0x18 |
                        ((ulong)key._M_manager & 0xff00000000) >> 8 |
                        ((ulong)key._M_manager & 0xff000000) << 8 |
                        ((ulong)key._M_manager & 0xff0000) << 0x18 |
                        ((ulong)key._M_manager & 0xff00) << 0x28 | (long)key._M_manager << 0x38);
      std::any::operator=(v,(double *)&sz_be);
    }
    break;
  case 0xcc:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      std::any::operator=(v,(uchar *)&key);
    }
    break;
  case 0xcd:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)CONCAT62(stack0xffffffffffffff92,
                                (ushort)key._M_manager << 8 | (ushort)key._M_manager >> 8);
      std::any::operator=(v,(unsigned_short *)&sz_be);
    }
    break;
  case 0xce:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)CONCAT44(uStack_6c,
                                (uint)key._M_manager >> 0x18 |
                                ((uint)key._M_manager & 0xff0000) >> 8 |
                                ((uint)key._M_manager & 0xff00) << 8 | (uint)key._M_manager << 0x18)
      ;
      std::any::operator=(v,&sz_be);
    }
    break;
  case 0xcf:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)((ulong)key._M_manager >> 0x38 |
                        ((ulong)key._M_manager & 0xff000000000000) >> 0x28 |
                        ((ulong)key._M_manager & 0xff0000000000) >> 0x18 |
                        ((ulong)key._M_manager & 0xff00000000) >> 8 |
                        ((ulong)key._M_manager & 0xff000000) << 8 |
                        ((ulong)key._M_manager & 0xff0000) << 0x18 |
                        ((ulong)key._M_manager & 0xff00) << 0x28 | (long)key._M_manager << 0x38);
      std::any::operator=(v,(unsigned_long *)&sz_be);
    }
    break;
  case 0xd0:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      std::any::operator=(v,(char *)&key);
    }
    break;
  case 0xd1:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)CONCAT62(stack0xffffffffffffff92,
                                (ushort)key._M_manager << 8 | (ushort)key._M_manager >> 8);
      std::any::operator=(v,(short *)&sz_be);
    }
    break;
  case 0xd2:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)CONCAT44(uStack_6c,
                                (uint)key._M_manager >> 0x18 |
                                ((uint)key._M_manager & 0xff0000) >> 8 |
                                ((uint)key._M_manager & 0xff00) << 8 | (uint)key._M_manager << 0x18)
      ;
      std::any::operator=(v,(int *)&sz_be);
    }
    break;
  case 0xd3:
    plVar7 = (long *)std::istream::read((char *)input,(long)&key);
    bVar11 = *(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0;
    if (bVar11) {
      _sz_be = (double)((ulong)key._M_manager >> 0x38 |
                        ((ulong)key._M_manager & 0xff000000000000) >> 0x28 |
                        ((ulong)key._M_manager & 0xff0000000000) >> 0x18 |
                        ((ulong)key._M_manager & 0xff00000000) >> 8 |
                        ((ulong)key._M_manager & 0xff000000) << 8 |
                        ((ulong)key._M_manager & 0xff0000) << 0x18 |
                        ((ulong)key._M_manager & 0xff00) << 0x28 | (long)key._M_manager << 0x38);
      std::any::operator=(v,(long *)&sz_be);
    }
    break;
  case 0xd9:
    std::istream::get();
    if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_58;
      key._M_storage._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)&key);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key);
        goto LAB_00135a45;
      }
      goto LAB_001359db;
    }
    goto LAB_0013584f;
  case 0xda:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_58;
      key._M_storage._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)&key);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key);
        goto LAB_00135a45;
      }
      goto LAB_001359db;
    }
    goto LAB_0013584f;
  case 0xdb:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_58;
      key._M_storage._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::resize((ulong)&key);
      plVar7 = (long *)std::istream::read((char *)input,(long)key._M_manager);
      if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
        bVar11 = true;
        std::any::operator=(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &key);
        goto LAB_00135a45;
      }
      goto LAB_001359db;
    }
    goto LAB_0013584f;
  case 0xdc:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      std::vector<std::any,_std::allocator<std::any>_>::vector
                ((vector<std::any,_std::allocator<std::any>_> *)&key,
                 (ulong)(ushort)((ushort)sz_be << 8 | (ushort)sz_be >> 8),
                 (allocator_type *)&local_71);
      bVar11 = true;
      lVar9 = 0;
      for (uVar8 = 0;
          (bVar11 != false &&
          (uVar8 < (ulong)((long)key._M_storage._M_ptr - (long)key._M_manager >> 4)));
          uVar8 = uVar8 + 1) {
        bVar11 = deserialize(input,(any *)(key._M_manager + lVar9));
        lVar9 = lVar9 + 0x10;
      }
      std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)&key);
LAB_001359ec:
      std::vector<std::any,_std::allocator<std::any>_>::~vector
                ((vector<std::any,_std::allocator<std::any>_> *)&key);
      return bVar11;
    }
    goto LAB_0013584f;
  case 0xdd:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      std::vector<std::any,_std::allocator<std::any>_>::vector
                ((vector<std::any,_std::allocator<std::any>_> *)&key,
                 (ulong)(sz_be >> 0x18 | (sz_be & 0xff0000) >> 8 | (sz_be & 0xff00) << 8 |
                        sz_be << 0x18),(allocator_type *)&local_71);
      bVar11 = true;
      lVar9 = 0;
      for (uVar8 = 0;
          (bVar11 != false &&
          (uVar8 < (ulong)((long)key._M_storage._M_ptr - (long)key._M_manager >> 4)));
          uVar8 = uVar8 + 1) {
        bVar11 = deserialize(input,(any *)(key._M_manager + lVar9));
        lVar9 = lVar9 + 0x10;
      }
      std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)&key);
      goto LAB_001359ec;
    }
    goto LAB_0013584f;
  case 0xde:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      local_58._8_8_ = &key._M_storage;
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      key._M_storage._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = 0;
      local_40 = 0;
      local_48 = (_Storage *)local_58._8_8_;
      std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                             *)&key);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)&key);
      local_38 = (ulong)(ushort)((ushort)sz_be << 8 | (ushort)sz_be >> 8);
      bVar11 = true;
      uVar8 = 0;
      while( true ) {
        if (bVar11 == false) {
          return false;
        }
        if (local_38 <= uVar8) break;
        key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        key._M_storage._M_ptr = (void *)0x0;
        bVar11 = deserialize(input,&key);
        if ((bVar11) && (bVar11 = is<std::__cxx11::string>(&key), bVar11)) {
          pmVar4 = std::
                   any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>&>
                             (v);
          pbVar5 = std::any_cast<std::__cxx11::string&>(&key);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::operator[](pmVar4,pbVar5);
          bVar11 = deserialize(input,pmVar6);
        }
        else {
          bVar11 = false;
        }
        std::any::reset(&key);
        uVar8 = uVar8 + 1;
      }
      return bVar11;
    }
    goto LAB_0013584f;
  case 0xdf:
    plVar7 = (long *)std::istream::read((char *)input,(long)&sz_be);
    if (*(int *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) == 0) {
      local_58._8_8_ = &key._M_storage;
      key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      key._M_storage._M_ptr = (void *)0x0;
      local_58._M_allocated_capacity = 0;
      local_40 = 0;
      local_48 = (_Storage *)local_58._8_8_;
      std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                             *)&key);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   *)&key);
      local_38 = (ulong)(sz_be >> 0x18 | (sz_be & 0xff0000) >> 8 | (sz_be & 0xff00) << 8 |
                        sz_be << 0x18);
      bVar11 = true;
      uVar8 = 0;
      while( true ) {
        if (bVar11 == false) {
          return false;
        }
        if (local_38 <= uVar8) break;
        key._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        key._M_storage._M_ptr = (void *)0x0;
        bVar11 = deserialize(input,&key);
        if ((bVar11) && (bVar11 = is<std::__cxx11::string>(&key), bVar11)) {
          pmVar4 = std::
                   any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>&>
                             (v);
          pbVar5 = std::any_cast<std::__cxx11::string&>(&key);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                   ::operator[](pmVar4,pbVar5);
          bVar11 = deserialize(input,pmVar6);
        }
        else {
          bVar11 = false;
        }
        std::any::reset(&key);
        uVar8 = uVar8 + 1;
      }
      return bVar11;
    }
LAB_0013584f:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool msgpack::deserialize(std::istream& input, any& v)
  {
    unsigned int typeByte = static_cast<unsigned int>(0xFF & input.get());
    bool ret = input.good();
    if (ret)
    {
      if (/*typeByte >= 0x00 &&*/ typeByte <= 0x7F) // positive fixint 0xxxxxxx
      {
        v = std::uint8_t(0x7F & typeByte);
      }
      else if (typeByte >= 0xE0 && typeByte <= 0xFF) // negative fixint	111xxxxx
      {
        v = std::int8_t((0x1F & typeByte ) * -1);
      }
      else if (typeByte >= 0x80 && typeByte <= 0x8F) // fixmap	1000xxxx
      {
        std::size_t sz(0x0F & typeByte);
        v = goodform::object_t();
        for (size_t i = 0; i < sz; ++i)
        {
          any key;
          if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
            ret = false;
          else
            ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
        }
      }
      else if (typeByte >= 0x90 && typeByte <= 0x9F) // fixarray	1001xxxx
      {
        std::size_t sz(0x0F & typeByte);
        goodform::array_t a(sz);
        for (size_t i = 0; i < sz; ++i)
          msgpack::deserialize(input, a[i]);
        v = std::move(a);
      }
      else if (typeByte >= 0xA0 && typeByte <= 0xBF) // fixstr	101xxxxx
      {
        std::size_t sz(0x1F & typeByte);
        std::string s;
        s.resize(sz);
        input.read(&s[0], sz);
        if (!input.good())
          ret = false;
        else
          v = std::move(s);
      }
      else if (typeByte == 0xC0) // null
      {
        v = nullptr;
      }
      else if (typeByte == 0xC2) // false
      {
        v = false;
      }
      else if (typeByte == 0xC3) // true
      {
        v = true;
      }
      else if (typeByte == 0xC4) // Bin 8
      {
        std::size_t sz (0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          goodform::binary_t b(sz);
          if (!input.read(b.data(), sz).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC5) // Bin 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be16toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC6) // Bin 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be32toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xCA) // Float 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union32 u;
          u.i = be32toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCB) // Float 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union64 u;
          u.i = be64toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCC) // Uint 8
      {
        std::uint8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xCD) // Uint 16
      {
        std::uint16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCE) // Uint 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCF) // Uint 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD0) // Int 8
      {
        std::int8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xD1) // Int 16
      {
        std::int16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD2) // Int 32
      {
        std::int32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD3) // Int 64
      {
        std::int64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD9) // str 8
      {
        std::size_t sz(0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          std::string s;
          s.resize(sz);
          if (!input.read(&s[0], sz).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDA) // str 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be16toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDB) // str 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be32toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDC) // array 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be16toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDD) // array 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be32toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDE) // map 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint16_t sz(be16toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else if (typeByte == 0xDF) // map 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint32_t sz(be32toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else // Not Supported
      {
        ret = false;
      }
    }

    return ret;
  }